

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

Am_Object do_search_backward(Am_Value_List *parts,Am_Value_List *old_sel_list,
                            Am_Value_List *slots_and_values_used)

{
  bool bVar1;
  Am_Wrapper *value;
  ostream *poVar2;
  Am_Value *pAVar3;
  Am_Object_Data *in_RCX;
  int local_40;
  int index;
  Am_Object local_30;
  Am_Object object;
  Am_Value_List *slots_and_values_used_local;
  Am_Value_List *old_sel_list_local;
  Am_Value_List *parts_local;
  
  object.data = in_RCX;
  Am_Value_List::End(old_sel_list);
  Am_Object::Am_Object(&local_30);
  bVar1 = Am_Value_List::Valid(slots_and_values_used);
  if (bVar1) {
    local_40 = -1;
    while (bVar1 = Am_Value_List::First(old_sel_list), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar3 = Am_Value_List::Get(old_sel_list);
      Am_Object::operator=(&local_30,pAVar3);
      value = Am_Object::operator_cast_to_Am_Wrapper_(&local_30);
      bVar1 = Am_Value_List::Start_Member(slots_and_values_used,value);
      if (bVar1) {
        local_40 = Am_Value_List::Nth(old_sel_list);
      }
      Am_Value_List::Prev(old_sel_list);
    }
    if (local_40 == -1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar2 = std::operator<<(poVar2,"Lost old value ");
      poVar2 = operator<<(poVar2,slots_and_values_used);
      poVar2 = std::operator<<(poVar2," from parts list for selection widget ");
      poVar2 = operator<<(poVar2,old_sel_list);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    if (local_40 == 0) {
      Am_Object::Am_Object((Am_Object *)parts,&Am_No_Object);
      goto LAB_002cb5fc;
    }
    Am_Value_List::Move_Nth(old_sel_list,local_40 + -1);
  }
  while (bVar1 = Am_Value_List::First(old_sel_list), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar3 = Am_Value_List::Get(old_sel_list);
    Am_Object::operator=(&local_30,pAVar3);
    bVar1 = test_match_object(&local_30,(Am_Value_List *)object.data);
    if (bVar1) {
      Am_Object::Am_Object((Am_Object *)parts,&local_30);
      goto LAB_002cb5fc;
    }
    Am_Value_List::Prev(old_sel_list);
  }
  Am_Object::Am_Object((Am_Object *)parts,&Am_No_Object);
LAB_002cb5fc:
  Am_Object::~Am_Object(&local_30);
  return (Am_Object)(Am_Object_Data *)parts;
}

Assistant:

Am_Object
do_search_backward(Am_Value_List &parts, Am_Value_List &old_sel_list,
                   Am_Value_List &slots_and_values_used)
{
  //move parts list to the first selected part
  parts.End();
  Am_Object object;
  if (old_sel_list.Valid()) {
    int index = -1;
    for (; !parts.First(); parts.Prev()) {
      object = parts.Get();
      if (old_sel_list.Start_Member(object))
        index = parts.Nth();
    }
    if (index == -1)
      Am_ERROR("Lost old value " << old_sel_list
                                 << " from parts list for selection widget "
                                 << parts);
    if (index == 0) { //already at beginning
      return Am_No_Object;
    }
    parts.Move_Nth(index - 1);
  }
  //now search forward for new object
  for (; !parts.First(); parts.Prev()) {
    object = parts.Get();
    if (test_match_object(object, slots_and_values_used))
      return object;
  }
  return Am_No_Object;
}